

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void zisofs_detect_magic(archive_write *a,void *buff,size_t s)

{
  byte bVar1;
  void *pvVar2;
  long lVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int64_t iVar7;
  size_t local_80;
  size_t l;
  int64_t entry_size;
  int magic_max;
  uint32_t bed;
  uint32_t bst;
  size_t doff;
  size_t _ceil;
  uchar log2_bs;
  uchar header_size;
  long *plStack_48;
  uint32_t uncompressed_size;
  uchar *magic_buff;
  uchar *endp;
  uchar *p;
  isofile *file;
  iso9660_conflict *iso9660;
  size_t s_local;
  void *buff_local;
  archive_write *a_local;
  
  pvVar2 = a->format_data;
  lVar3 = *(long *)((long)pvVar2 + 0x10);
  iVar7 = archive_entry_size(*(archive_entry **)(lVar3 + 0x20));
  if (iVar7 < 0x40) {
    entry_size._4_4_ = (int)iVar7;
  }
  else {
    entry_size._4_4_ = 0x40;
  }
  if ((*(int *)((long)pvVar2 + 0x21c) != 0) ||
     (plStack_48 = (long *)buff, s < (ulong)(long)entry_size._4_4_)) {
    if (*(int *)((long)pvVar2 + 0x21c) < entry_size._4_4_) {
      local_80 = 0x40 - (long)*(int *)((long)pvVar2 + 0x21c);
      if (s < local_80) {
        local_80 = s;
      }
      memcpy((void *)((long)pvVar2 + (long)*(int *)((long)pvVar2 + 0x21c) + 0x1d9),buff,local_80);
      *(int *)((long)pvVar2 + 0x21c) = (int)local_80 + *(int *)((long)pvVar2 + 0x21c);
      if (*(int *)((long)pvVar2 + 0x21c) < entry_size._4_4_) {
        return;
      }
    }
    plStack_48 = (long *)((long)pvVar2 + 0x1d9);
  }
  *(byte *)((long)pvVar2 + 0x1d8) = *(byte *)((long)pvVar2 + 0x1d8) & 0xfe;
  if (*plStack_48 == 0x7d6dbc99653e437) {
    uVar4 = archive_le32dec(plStack_48 + 1);
    bVar1 = *(byte *)((long)plStack_48 + 0xd);
    if ((((0x17 < uVar4) && (*(char *)((long)plStack_48 + 0xc) == '\x04')) && (bVar1 < 0x1f)) &&
       (6 < bVar1)) {
      doff = (long)((ulong)uVar4 + (1L << (bVar1 & 0x3f)) + -1) >> (bVar1 & 0x3f);
      _bed = (doff + 1) * 4 + 0x10;
      if ((long)_bed <= iVar7) {
        endp = (uchar *)(plStack_48 + 2);
        for (; doff != 0 && endp + 8 <= (uchar *)((long)plStack_48 + (long)entry_size._4_4_);
            doff = doff - 1) {
          uVar5 = archive_le32dec(endp);
          if (uVar5 != _bed) {
            return;
          }
          endp = endp + 4;
          uVar6 = archive_le32dec(endp);
          if (uVar6 < uVar5) {
            return;
          }
          if (iVar7 < (long)(ulong)uVar6) {
            return;
          }
          _bed = (uVar6 - uVar5) + _bed;
        }
        *(uint32_t *)(lVar3 + 0xc4) = uVar4;
        *(undefined1 *)(lVar3 + 0xc0) = 4;
        *(byte *)(lVar3 + 0xc1) = bVar1;
        *(byte *)((long)pvVar2 + 0x1d8) = *(byte *)((long)pvVar2 + 0x1d8) & 0xfd;
      }
    }
  }
  return;
}

Assistant:

static void
zisofs_detect_magic(struct archive_write *a, const void *buff, size_t s)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isofile *file = iso9660->cur_file;
	const unsigned char *p, *endp;
	const unsigned char *magic_buff;
	uint32_t uncompressed_size;
	unsigned char header_size;
	unsigned char log2_bs;
	size_t _ceil, doff;
	uint32_t bst, bed;
	int magic_max;
	int64_t entry_size;

	entry_size = archive_entry_size(file->entry);
	if ((int64_t)sizeof(iso9660->zisofs.magic_buffer) > entry_size)
		magic_max = (int)entry_size;
	else
		magic_max = sizeof(iso9660->zisofs.magic_buffer);

	if (iso9660->zisofs.magic_cnt == 0 && s >= (size_t)magic_max)
		/* It's unnecessary we copy buffer. */
		magic_buff = buff;
	else {
		if (iso9660->zisofs.magic_cnt < magic_max) {
			size_t l;

			l = sizeof(iso9660->zisofs.magic_buffer)
			    - iso9660->zisofs.magic_cnt;
			if (l > s)
				l = s;
			memcpy(iso9660->zisofs.magic_buffer
			    + iso9660->zisofs.magic_cnt, buff, l);
			iso9660->zisofs.magic_cnt += (int)l;
			if (iso9660->zisofs.magic_cnt < magic_max)
				return;
		}
		magic_buff = iso9660->zisofs.magic_buffer;
	}
	iso9660->zisofs.detect_magic = 0;
	p = magic_buff;

	/* Check the magic code of zisofs. */
	if (memcmp(p, zisofs_magic, sizeof(zisofs_magic)) != 0)
		/* This is not zisofs file which made by mkzftree. */
		return;
	p += sizeof(zisofs_magic);

	/* Read a zisofs header. */
	uncompressed_size = archive_le32dec(p);
	header_size = p[4];
	log2_bs = p[5];
	if (uncompressed_size < 24 || header_size != 4 ||
	    log2_bs > 30 || log2_bs < 7)
		return;/* Invalid or not supported header. */

	/* Calculate a size of Block Pointers of zisofs. */
	_ceil = (uncompressed_size +
	        (ARCHIVE_LITERAL_LL(1) << log2_bs) -1) >> log2_bs;
	doff = (_ceil + 1) * 4 + 16;
	if (entry_size < (int64_t)doff)
		return;/* Invalid data. */

	/* Check every Block Pointer has valid value. */
	p = magic_buff + 16;
	endp = magic_buff + magic_max;
	while (_ceil && p + 8 <= endp) {
		bst = archive_le32dec(p);
		if (bst != doff)
			return;/* Invalid data. */
		p += 4;
		bed = archive_le32dec(p);
		if (bed < bst || bed > entry_size)
			return;/* Invalid data. */
		doff += bed - bst;
		_ceil--;
	}

	file->zisofs.uncompressed_size = uncompressed_size;
	file->zisofs.header_size = header_size;
	file->zisofs.log2_bs = log2_bs;

	/* Disable making a zisofs image. */
	iso9660->zisofs.making = 0;
}